

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void Join<stTimeoutItem_t,stTimeoutItemLink_t>
               (stTimeoutItemLink_t *apLink,stTimeoutItemLink_t *apOther)

{
  stTimeoutItem_t *psVar1;
  stTimeoutItem_t *psVar2;
  
  psVar1 = apOther->head;
  psVar2 = psVar1;
  if (psVar1 != (stTimeoutItem_t *)0x0) {
    for (; psVar2 != (stTimeoutItem_t *)0x0; psVar2 = psVar2->pNext) {
      psVar2->pLink = apLink;
    }
    psVar2 = apLink->tail;
    if (psVar2 == (stTimeoutItem_t *)0x0) {
      apLink->head = psVar1;
    }
    else {
      psVar2->pNext = psVar1;
      psVar1->pPrev = psVar2;
    }
    apLink->tail = apOther->tail;
    apOther->head = (stTimeoutItem_t *)0x0;
    apOther->tail = (stTimeoutItem_t *)0x0;
  }
  return;
}

Assistant:

void inline Join( TLink*apLink,TLink *apOther )
{
	//printf("apOther %p\n",apOther);
	if( !apOther->head )
	{
		return ;
	}
	TNode *lp = apOther->head;
	while( lp )
	{
		lp->pLink = apLink;
		lp = lp->pNext;
	}
	lp = apOther->head;
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)lp;
		lp->pPrev = apLink->tail;
		apLink->tail = apOther->tail;
	}
	else
	{
		apLink->head = apOther->head;
		apLink->tail = apOther->tail;
	}

	apOther->head = apOther->tail = NULL;
}